

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

int lws_vbi_decode(void *buf,uint64_t *value,size_t len)

{
  ulong uVar1;
  uint8_t *p;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  if ((long)len < 1) {
    return 0;
  }
  iVar3 = 0;
  uVar1 = 0;
  uVar4 = 0;
  uVar2 = (long)buf + 1;
  while( true ) {
    uVar4 = (ulong)(*(byte *)(uVar2 - 1) & 0x7f) << ((byte)uVar1 & 0x3f) | uVar4;
    if ((char)*(byte *)(uVar2 - 1) < '\0') {
      *value = uVar4;
      return iVar3;
    }
    if (0x38 < uVar1) break;
    uVar1 = uVar1 + 7;
    iVar3 = iVar3 + 1;
    bVar5 = len + (long)buf <= uVar2;
    uVar2 = uVar2 + 1;
    if (bVar5) {
      return 0;
    }
  }
  return 0;
}

Assistant:

int
lws_vbi_decode(const void *buf, uint64_t *value, size_t len)
{
	const uint8_t *p = (const uint8_t *)buf, *end = p + len;
	uint64_t v = 0;
	int s = 0;

	while (p < end) {
		v |= (((uint64_t)(*p)) & 0x7f) << s;
		if (*p & 0x80) {
			*value = v;

			return lws_ptr_diff(p, buf);
		}
		s += 7;
		if (s >= 64)
			return 0;
		p++;
	}

	return 0;
}